

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O0

string * benchmark::FormatString_abi_cxx11_(char *msg,__va_list_tag *args)

{
  pointer pcVar1;
  undefined8 *in_RDX;
  char *in_RSI;
  string *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> buff;
  int ret;
  char local_buff [256];
  size_t size;
  va_list args_cp;
  char *in_stack_fffffffffffffe48;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_fffffffffffffe50;
  allocator *paVar2;
  char *in_stack_fffffffffffffe58;
  CheckHandler *in_stack_fffffffffffffe60;
  string *this;
  allocator local_182;
  byte local_181;
  CheckHandler local_180 [2];
  allocator local_16d [20];
  byte local_159;
  CheckHandler local_158;
  int local_14c;
  char local_148 [264];
  ulong local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 *local_18;
  char *local_10;
  
  local_28 = in_RDX[2];
  local_38 = *in_RDX;
  uStack_30 = in_RDX[1];
  local_40 = 0x100;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_14c = vsnprintf(local_148,0x100,in_RSI,&local_38);
  local_159 = 0;
  if (local_14c < 0) {
    in_stack_fffffffffffffe60 = &local_158;
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)this,(char *)in_RDI,(char *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    local_159 = 1;
    internal::CheckHandler::GetLog(in_stack_fffffffffffffe60);
  }
  else {
    internal::GetNullLogInstance();
  }
  if ((local_159 & 1) != 0) {
    internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_001ab409);
  }
  if (local_14c == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else if ((ulong)(long)local_14c < local_40) {
    paVar2 = local_16d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_148,paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_16d);
  }
  else {
    local_40 = (long)local_14c + 1;
    operator_new__(local_40);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_fffffffffffffe50);
    local_14c = vsnprintf(pcVar1,local_40,local_10,local_18);
    local_181 = 0;
    if ((local_14c < 1) || (local_40 <= (ulong)(long)local_14c)) {
      internal::CheckHandler::CheckHandler
                ((CheckHandler *)this,(char *)in_RDI,(char *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      local_181 = 1;
      internal::CheckHandler::GetLog(local_180);
    }
    else {
      internal::GetNullLogInstance();
    }
    if ((local_181 & 1) != 0) {
      internal::CheckHandler::~CheckHandler((CheckHandler *)&UNK_001ab573);
    }
    pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_fffffffffffffe50);
    paVar2 = &local_182;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_182);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)paVar2);
  }
  return this;
}

Assistant:

std::string FormatString(const char *msg, va_list args) {
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  std::size_t size = 256;
  char local_buff[256];
  auto ret = std::vsnprintf(local_buff, size, msg, args_cp);

  va_end(args_cp);

  // currently there is no error handling for failure, so this is hack.
  CHECK(ret >= 0);

  if (ret == 0) // handle empty expansion
    return {};
  else if (static_cast<size_t>(ret) < size)
    return local_buff;
  else {
    // we did not provide a long enough buffer on our first attempt.
    size = (size_t)ret + 1; // + 1 for the null byte
    std::unique_ptr<char[]> buff(new char[size]);
    ret = std::vsnprintf(buff.get(), size, msg, args);
    CHECK(ret > 0 && ((size_t)ret) < size);
    return buff.get();
  }
}